

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::pumpFromFile
          (AsyncStreamFd *this,FileInputStream *input,int fileFd,uint64_t amount,uint64_t soFar)

{
  _func_int **pp_Var1;
  SourceLocation location;
  undefined8 uVar2;
  OwnPromiseNode OVar3;
  int osErrorNumber;
  ssize_t sVar4;
  void *pvVar5;
  undefined4 in_register_00000014;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:285:21)>
  *location_00;
  int __in_fd;
  PromiseFulfiller<void> *in_R9;
  size_t __count;
  off_t offset;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Fault f;
  undefined1 local_b8 [16];
  FileInputStream *local_a8;
  PromiseFulfiller<void> *local_a0;
  AsyncInputStream local_98;
  OwnPromiseNode local_90;
  code *local_88;
  OwnPromiseNode local_80;
  anon_class_40_5_87a5c74d_for_func local_78;
  undefined *local_50;
  undefined *puStack_48;
  undefined8 local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  local_a8 = (FileInputStream *)CONCAT44(in_register_00000014,fileFd);
  local_b8._8_8_ = this;
  local_a0 = (PromiseFulfiller<void> *)soFar;
  do {
    __count = (long)local_a0 - (long)in_R9;
    if (local_a0 < in_R9 || __count == 0) {
LAB_0038de92:
      uVar2 = local_b8._8_8_;
      Promise<unsigned_long>::Promise
                ((Promise<unsigned_long> *)local_b8._8_8_,(FixVoid<unsigned_long>)in_R9);
      return (Promise<unsigned_long>)(PromiseNode *)uVar2;
    }
    local_98._vptr_AsyncInputStream = (_func_int **)local_a8->offset;
    if (0xfffffffe < __count) {
      __count = 0xffffffff;
    }
    do {
      __in_fd = (int)amount;
      sVar4 = sendfile64((int)input->offset,__in_fd,(__off64_t *)&local_98,__count);
      if (-1 < sVar4) {
        if (sVar4 != 0) goto LAB_0038dcd1;
        goto LAB_0038de92;
      }
      osErrorNumber = kj::_::Debug::getOsErrorNumber(false);
      uVar2 = local_b8._8_8_;
    } while (osErrorNumber == -1);
    if (osErrorNumber != 0) {
      if (osErrorNumber == 0xb) {
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_b8);
        local_78.input = local_a8;
        local_78.amount = (uint64_t)local_a0;
        local_88 = kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:285:21)>
                   ::anon_class_40_5_87a5c74d_for_func::operator();
        pp_Var1 = ((SleepHooks *)&((PromiseArenaMember *)local_b8._0_8_)->arena)->_vptr_SleepHooks;
        local_78.this = (AsyncStreamFd *)input;
        local_78.fileFd = __in_fd;
        local_78.soFar = (uint64_t)in_R9;
        if (pp_Var1 == (_func_int **)0x0 || (ulong)(local_b8._0_8_ - (long)pp_Var1) < 0x48) {
          pvVar5 = operator_new(0x400);
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:285:21)>
                         *)((long)pvVar5 + 0x3b8);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromFile(kj::FileInputStream&,int,unsigned_long,unsigned_long)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromFile(kj::FileInputStream&,int,unsigned_long,unsigned_long)::_lambda()_2_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_b8,
                     &local_78,&local_88);
          *(void **)((long)pvVar5 + 0x3c0) = pvVar5;
        }
        else {
          ((SleepHooks *)&((PromiseArenaMember *)local_b8._0_8_)->arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:285:21)>
                         *)((unsigned_long *)(local_b8._0_8_ + -0x50) + 1);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromFile(kj::FileInputStream&,int,unsigned_long,unsigned_long)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::pumpFromFile(kj::FileInputStream&,int,unsigned_long,unsigned_long)::_lambda()_2_,void*&>
                    (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_b8,
                     &local_78,&local_88);
          *(_func_int ***)(local_b8._0_8_ + -0x40) = pp_Var1;
        }
        local_50 = &DAT_003d3151;
        puStack_48 = &DAT_003d31b0;
        local_40 = 0x4c0000058b;
        location.function = &DAT_003d31b0;
        location.fileName = &DAT_003d3151;
        location.lineNumber = 0x58b;
        location.columnNumber = 0x4c;
        local_90.ptr = (PromiseNode *)location_00;
        kj::_::maybeChain<unsigned_long>(&local_80,(Promise<unsigned_long> *)&local_90,location);
        OVar3.ptr = local_80.ptr;
        local_80.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_80);
        uVar2 = local_b8._8_8_;
        *(PromiseNode **)local_b8._8_8_ = OVar3.ptr;
        local_38.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_b8);
        return (Promise<unsigned_long>)(PromiseNode *)uVar2;
      }
      if ((osErrorNumber != 0x26) && (osErrorNumber != 0x16)) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)&local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x122,osErrorNumber,"sendfile","");
        kj::_::Debug::Fault::fatal((Fault *)&local_78);
      }
      unoptimizedPumpTo((kj *)local_b8._8_8_,&local_a8->super_AsyncInputStream,
                        (AsyncOutputStream *)&input->file,(uint64_t)local_a0,(uint64_t)in_R9);
      return (Promise<unsigned_long>)(PromiseNode *)uVar2;
    }
LAB_0038dcd1:
    local_a8->offset = (uint64_t)local_98._vptr_AsyncInputStream;
    in_R9 = (PromiseFulfiller<void> *)
            ((long)&(in_R9->super_PromiseRejector)._vptr_PromiseRejector + sVar4);
  } while( true );
}

Assistant:

Promise<uint64_t> pumpFromFile(FileInputStream& input, int fileFd,
                                 uint64_t amount, uint64_t soFar) {
    while (soFar < amount) {
      off_t offset = input.getOffset();
      ssize_t n;

      // Although sendfile()'s last argument has type size_t, on Linux it seems to cause EINVAL
      // if we pass an amount that is greater than UINT32_MAX, so make sure to clamp to that. In
      // practice, of course, we'll be limited to the socket buffer size.
      size_t requested = kj::min(amount - soFar, (uint32_t)kj::maxValue);

      KJ_SYSCALL_HANDLE_ERRORS(n = sendfile(fd, fileFd, &offset, requested)) {
        case EINVAL:
        case ENOSYS:
          // Fall back to regular pump
          return unoptimizedPumpTo(input, *this, amount, soFar);

        case EAGAIN:
          return observer.whenBecomesWritable()
              .then([this, &input, fileFd, amount, soFar]() {
            return pumpFromFile(input, fileFd, amount, soFar);
          });

        default:
          KJ_FAIL_SYSCALL("sendfile", error);
      }

      if (n == 0) break;

      input.seek(offset);  // NOTE: sendfile() updated `offset` in-place.
      soFar += n;
    }

    return soFar;
  }